

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

void __thiscall
cs::compiler_type::preprocessor::new_empty_line(preprocessor *this,context_t *context)

{
  iterator *piVar1;
  element_type *peVar2;
  _Elt_pointer pbVar3;
  
  peVar2 = (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pbVar3 = (peVar2->file_buff).
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pbVar3 == *(_Elt_pointer *)
                 ((long)&(peVar2->file_buff).
                         super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish + 0x10) + -1) {
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_push_back_aux<>(&peVar2->file_buff);
  }
  else {
    (pbVar3->_M_dataplus)._M_p = (pointer)&pbVar3->field_2;
    pbVar3->_M_string_length = 0;
    (pbVar3->field_2)._M_local_buf[0] = '\0';
    piVar1 = &(peVar2->file_buff).
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  this->empty_line = true;
  this->line_num = this->line_num + 1;
  return;
}

Assistant:

void new_empty_line(const context_t &context)
		{
			context->file_buff.emplace_back();
			empty_line = true;
			++line_num;
		}